

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

FunctionData *
anon_unknown.dwarf_c3752::ImplementPrototype(ExpressionContext *ctx,FunctionData *function)

{
  int iVar1;
  FunctionData *function_00;
  uint hash;
  Node *start;
  Node *pNVar2;
  Node *pNVar3;
  FunctionData *prototype;
  ScopeData *pSVar4;
  NodeIterator NVar5;
  
  pSVar4 = ctx->scope;
  if ((pSVar4->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
    pSVar4 = ctx->globalScope;
  }
  hash = NULLC::GetStringHash((function->name->name).begin,(function->name->name).end);
  NVar5 = DirectChainedMap<IdentifierLookupResult>::first(&pSVar4->idLookupMap,hash);
  pNVar3 = NVar5.node;
  if (NVar5.node != (Node *)0x0) {
    while( true ) {
      function_00 = *(FunctionData **)(pNVar3 + 0x10);
      if (((function_00 != function && function_00 != (FunctionData *)0x0) &&
          (function_00->isPrototype == true)) && (function_00->type == function->type)) {
        function_00->implementation = function;
        ExpressionContext::HideFunction(ctx,function_00);
        return function_00;
      }
      pNVar2 = *(Node **)(pNVar3 + 0x18);
      if (pNVar2 == NVar5.start) break;
      iVar1 = *(int *)pNVar3;
      while( true ) {
        if (pNVar2 == (Node *)0x0) {
          return (FunctionData *)0x0;
        }
        pNVar3 = pNVar2;
        if (*(int *)pNVar2 == iVar1) break;
        pNVar2 = *(Node **)(pNVar2 + 0x18);
        if (pNVar2 == NVar5.start) {
          return (FunctionData *)0x0;
        }
      }
    }
  }
  return (FunctionData *)0x0;
}

Assistant:

FunctionData* ImplementPrototype(ExpressionContext &ctx, FunctionData *function)
	{
		ScopeData *lookupScope = ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE ? ctx.globalScope : ctx.scope;

		if(DirectChainedMap<IdentifierLookupResult>::NodeIterator curr = lookupScope->idLookupMap.first(function->name->name.hash()))
		{
			while(curr)
			{
				FunctionData *option = curr.node->value.function;

				if(option && option != function && option->isPrototype && option->type == function->type)
					break;

				curr = ctx.scope->idLookupMap.next(curr);
			}

			if(curr)
			{
				FunctionData *prototype = curr.node->value.function;

				prototype->implementation = function;

				ctx.HideFunction(prototype);

				return prototype;
			}
		}

		return NULL;
	}